

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleIndexVertexArray.cpp
# Opt level: O0

void __thiscall
btTriangleIndexVertexArray::btTriangleIndexVertexArray
          (btTriangleIndexVertexArray *this,int numTriangles,int *triangleIndexBase,
          int triangleIndexStride,int numVertices,btScalar *vertexBase,int vertexStride)

{
  btTriangleIndexVertexArray *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  btIndexedMesh mesh;
  btStridingMeshInterface *in_stack_ffffffffffffff90;
  btAlignedObjectArray<btIndexedMesh> *this_00;
  PHY_ScalarType indexType;
  undefined4 in_stack_ffffffffffffff9c;
  
  btStridingMeshInterface::btStridingMeshInterface(in_stack_ffffffffffffff90);
  *in_RDI = &PTR__btTriangleIndexVertexArray_002e5c18;
  this_00 = (btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3);
  btAlignedObjectArray<btIndexedMesh>::btAlignedObjectArray(this_00);
  indexType = (PHY_ScalarType)((ulong)this_00 >> 0x20);
  *(undefined4 *)(in_RDI + 8) = 0;
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x44));
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x54));
  btIndexedMesh::btIndexedMesh((btIndexedMesh *)&stack0xffffffffffffff98);
  addIndexedMesh(in_RDX,(btIndexedMesh *)CONCAT44(in_stack_ffffffffffffff9c,in_ESI),indexType);
  return;
}

Assistant:

btTriangleIndexVertexArray::btTriangleIndexVertexArray(int numTriangles,int* triangleIndexBase,int triangleIndexStride,int numVertices,btScalar* vertexBase,int vertexStride)
: m_hasAabb(0)
{
	btIndexedMesh mesh;

	mesh.m_numTriangles = numTriangles;
	mesh.m_triangleIndexBase = (const unsigned char *)triangleIndexBase;
	mesh.m_triangleIndexStride = triangleIndexStride;
	mesh.m_numVertices = numVertices;
	mesh.m_vertexBase = (const unsigned char *)vertexBase;
	mesh.m_vertexStride = vertexStride;

	addIndexedMesh(mesh);

}